

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatryoshkaDAG.cpp
# Opt level: O3

WeightedDomainEnsemble * __thiscall
MatryoshkaDAG::extractTopK
          (WeightedDomainEnsemble *__return_storage_ptr__,MatryoshkaDAG *this,float areaCovered)

{
  double *pdVar1;
  iterator __position;
  MatryoshkaParams *pMVar2;
  long lVar3;
  size_t i;
  DomainSet local_48;
  
  (__return_storage_ptr__->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->domainSets).
  super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->domainSets).
  super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->domainSets).
  super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->params->K != 0) {
    lVar3 = 0;
    i = 0;
    do {
      extractDomains(&local_48,this,i,areaCovered);
      std::
      vector<std::vector<Domain,std::allocator<Domain>>,std::allocator<std::vector<Domain,std::allocator<Domain>>>>
      ::emplace_back<std::vector<Domain,std::allocator<Domain>>>
                ((vector<std::vector<Domain,std::allocator<Domain>>,std::allocator<std::vector<Domain,std::allocator<Domain>>>>
                  *)__return_storage_ptr__,&local_48);
      if (local_48.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pMVar2 = this->params;
      pdVar1 = *(double **)
                &(this->OPT).
                 super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[pMVar2->n].
                 super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                 ._M_impl.super__Vector_impl_data;
      local_48.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(*(double *)((long)pdVar1 + lVar3) / *pdVar1);
      __position._M_current =
           (__return_storage_ptr__->weights).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->weights).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&__return_storage_ptr__->weights,__position,(double *)&local_48);
        pMVar2 = this->params;
      }
      else {
        *__position._M_current =
             (double)local_48.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                     super__Vector_impl_data._M_start;
        (__return_storage_ptr__->weights).super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      i = i + 1;
      lVar3 = lVar3 + 0x18;
    } while (i < pMVar2->K);
  }
  return __return_storage_ptr__;
}

Assistant:

WeightedDomainEnsemble MatryoshkaDAG::extractTopK(float areaCovered) {
    WeightedDomainEnsemble ensemble;

    for (size_t i = 0; i < params->K; i++) { 
        ensemble.domainSets.push_back( extractDomains(i, areaCovered) );
        ensemble.weights.push_back( OPT[params->n][i].score/OPT[params->n][0].score );
    }

    return ensemble;
}